

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_from_hex(char *hex,uint32_t flags,wally_tx **output)

{
  ulong local_858;
  int local_84c;
  int ret;
  size_t written;
  size_t bin_len;
  size_t hex_len;
  uchar *buff_p;
  uchar buff [2048];
  wally_tx **output_local;
  uint32_t flags_local;
  char *hex_local;
  
  hex_len = (size_t)&buff_p;
  buff._2040_8_ = output;
  if (hex == (char *)0x0) {
    local_858 = 0;
  }
  else {
    local_858 = strlen(hex);
  }
  bin_len = local_858;
  if (((hex == (char *)0x0) || ((local_858 & 1) != 0)) || (buff._2040_8_ == 0)) {
    hex_local._4_4_ = -2;
  }
  else {
    written = local_858 >> 1;
    if ((written < 0x801) ||
       (hex_len = (size_t)wally_malloc(written), (void *)hex_len != (void *)0x0)) {
      local_84c = wally_hex_to_bytes(hex,(uchar *)hex_len,written,(size_t *)&stack0xfffffffffffff7b8
                                    );
      if (local_84c == 0) {
        local_84c = tx_from_bytes((uchar *)hex_len,written,flags,(wally_tx **)buff._2040_8_);
      }
      if ((uchar **)hex_len == &buff_p) {
        wally_clear(&buff_p,written);
      }
      else {
        clear_and_free((void *)hex_len,written);
      }
      hex_local._4_4_ = local_84c;
    }
    else {
      hex_local._4_4_ = -3;
    }
  }
  return hex_local._4_4_;
}

Assistant:

int wally_tx_from_hex(const char *hex, uint32_t flags,
                      struct wally_tx **output)
{
    unsigned char buff[TX_STACK_SIZE], *buff_p = buff;
    size_t hex_len = hex ? strlen(hex) : 0, bin_len;
    size_t written;
    int ret;

    if (!hex || hex_len & 0x1 || !output)
        return WALLY_EINVAL;

    bin_len = hex_len / 2;

    if (bin_len > sizeof(buff)) {
        if ((buff_p = wally_malloc(bin_len)) == NULL)
            return WALLY_ENOMEM;
    }
    ret = wally_hex_to_bytes(hex, buff_p, bin_len, &written);
    if (ret == WALLY_OK)
        ret = tx_from_bytes(buff_p, bin_len, flags, output);

    if (buff_p != buff)
        clear_and_free(buff_p, bin_len);
    else
        wally_clear(buff, bin_len);

    return ret;
}